

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPandVC.cpp
# Opt level: O3

void __thiscall Graph::printResult(Graph *this,uint rootOrder,uint pointOrder)

{
  pointer ppVVar1;
  uint uVar2;
  ostream *poVar3;
  V *pVVar4;
  undefined8 *puVar5;
  undefined4 in_register_00000014;
  V *__args;
  long lVar6;
  ulong uVar7;
  long lVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  char local_39;
  void *local_38;
  iterator iStack_30;
  uint *local_28;
  
  __args = (V *)CONCAT44(in_register_00000014,pointOrder);
  if (rootOrder == pointOrder) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    return;
  }
  local_38 = (void *)0x0;
  iStack_30._M_current = (uint *)0x0;
  local_28 = (uint *)0x0;
  ppVVar1 = (this->verticesVector).super__Vector_base<V_*,_std::allocator<V_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(this->verticesVector).super__Vector_base<V_*,_std::allocator<V_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3;
  lVar8 = 0;
  do {
    pVVar4 = ppVVar1[lVar8];
    if (pVVar4->order == pointOrder) {
      __args = pVVar4;
    }
    lVar8 = lVar8 + 1;
  } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
  pVVar4 = __args->pParentVertex;
  if (pVVar4 != (V *)0x0) {
    do {
      if (iStack_30._M_current == local_28) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,iStack_30,
                   &__args->order);
        __args = __args->pParentVertex;
      }
      else {
        *iStack_30._M_current = __args->order;
        iStack_30._M_current = iStack_30._M_current + 1;
        __args = pVVar4;
      }
      pVVar4 = __args->pParentVertex;
    } while (pVVar4 != (V *)0x0);
    if (iStack_30._M_current != local_28) {
      *iStack_30._M_current = __args->order;
      iStack_30._M_current = iStack_30._M_current + 1;
      goto LAB_001087ad;
    }
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,iStack_30,&__args->order
            );
LAB_001087ad:
  uVar7 = (long)iStack_30._M_current - (long)local_38;
  if (*(uint *)((long)local_38 + ((long)(uVar7 * 0x40000000 + -0x100000000) >> 0x1e)) != rootOrder)
  {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "the path does not exsit.";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  uVar2 = (int)(uVar7 >> 2) - 1;
  if (0 < (int)uVar2) {
    lVar6 = (ulong)uVar2 + 1;
    do {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_39 = '-';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
    uVar7 = (long)iStack_30._M_current - (long)local_38;
  }
  if (uVar7 != 4) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if (local_38 != (void *)0x0) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void Graph::printResult(unsigned rootOrder,unsigned pointOrder)
{
    
    if(rootOrder == pointOrder)
    {
        std::cout<< rootOrder << std::endl;
        return;
    }


    V *Tmp;
    std::vector<unsigned> result;
    for(int i = 0; i < this->verticesVector.size(); i++)
    {
        if(pointOrder == this->verticesVector[i]->order)
        {
            Tmp = this->verticesVector[i];
        }
    }
    
    while (Tmp->pParentVertex != NULL)
    {
        result.push_back(Tmp->order);
        Tmp = Tmp->pParentVertex;
    }
    result.push_back(Tmp->order);
    int theLastIndex = result.size()-1;
    if(result[theLastIndex]!=rootOrder)
    {
        throw "the path does not exsit.";
        return;
    }
    else
    {
        for(int i = result.size()-1; i > 0; i--)
        {
            std::cout << result[i] <<'-';
        }
        if(result.size()!=1)
        {
            std::cout << result[0] << std::endl;
        }
    }
}